

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  size_type sVar1;
  int iVar2;
  int n;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  sVar4 = internal::WireFormatLite::Int32Size(&this->path_);
  uVar3 = (uint)sVar4;
  if (sVar4 == 0) {
    uVar5 = 0;
  }
  else if ((int)uVar3 < 0) {
    uVar5 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  (this->_path_cached_byte_size_).super___atomic_base<int>._M_i = uVar3;
  lVar7 = uVar5 + sVar4;
  sVar4 = internal::WireFormatLite::Int32Size(&this->span_);
  uVar3 = (uint)sVar4;
  if (sVar4 != 0) {
    if ((int)uVar3 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    lVar7 = lVar7 + uVar5;
  }
  (this->_span_cached_byte_size_).super___atomic_base<int>._M_i = uVar3;
  uVar3 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = lVar7 + sVar4 + (ulong)uVar3;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      lVar7 = *(long *)((long)((this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_)->
                              elements[uVar5] + 8);
      uVar6 = (uint)lVar7 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + lVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 3) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar1 = ((this->leading_comments_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      sVar1 = ((this->trailing_comments_).ptr_)->_M_string_length;
      uVar3 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar4;
    return sVar4;
  }
  sVar4 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar4,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _path_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _span_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(leading_detached_comments_.size());
  for (int i = 0, n = leading_detached_comments_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      leading_detached_comments_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string leading_comments = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_leading_comments());
    }

    // optional string trailing_comments = 4;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_trailing_comments());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}